

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_TypeRules.h
# Opt level: O0

bool soul::TypeRules::canSilentlyCastTo(Type *dest,Value *value)

{
  bool bVar1;
  int32_t iVar2;
  Type *source;
  int64_t value_00;
  float fVar3;
  double dVar4;
  Type *type;
  Value *value_local;
  Type *dest_local;
  
  source = soul::Value::getType(value);
  bVar1 = Type::isUnsizedArray(dest);
  if (bVar1) {
    dest_local._7_1_ = false;
  }
  else {
    bVar1 = canSilentlyCastTo(dest,source);
    if (bVar1) {
      dest_local._7_1_ = true;
    }
    else {
      bVar1 = Type::isBoundedInt(dest);
      if ((bVar1) &&
         ((bVar1 = Type::isInteger(source), bVar1 || (bVar1 = Type::isBoundedInt(source), bVar1))))
      {
        value_00 = soul::Value::getAsInt64(value);
        dest_local._7_1_ = Type::isValidBoundedIntIndex<long>(dest,value_00);
      }
      else {
        bVar1 = Type::isFloat32(dest);
        if (bVar1) {
          bVar1 = Type::isFloat64(source);
          if (bVar1) {
            fVar3 = soul::Value::getAsFloat(value);
            dVar4 = soul::Value::getAsDouble(value);
            return (double)fVar3 == dVar4;
          }
          bVar1 = Type::isInteger(source);
          if (bVar1) {
            fVar3 = soul::Value::getAsFloat(value);
            iVar2 = soul::Value::getAsInt32(value);
            return fVar3 == (float)iVar2;
          }
        }
        bVar1 = Type::isInteger(dest);
        if (bVar1) {
          bVar1 = Type::isFloat64(source);
          if (bVar1) {
            iVar2 = soul::Value::getAsInt32(value);
            dVar4 = soul::Value::getAsDouble(value);
            return (double)iVar2 == dVar4;
          }
          bVar1 = Type::isFloat32(source);
          if (bVar1) {
            iVar2 = soul::Value::getAsInt32(value);
            fVar3 = soul::Value::getAsFloat(value);
            return (float)iVar2 == fVar3;
          }
        }
        bVar1 = Type::isComplex32(dest);
        if (bVar1) {
          bVar1 = Type::isFloat64(source);
          if (bVar1) {
            fVar3 = soul::Value::getAsFloat(value);
            dVar4 = soul::Value::getAsDouble(value);
            return (double)fVar3 == dVar4;
          }
          bVar1 = Type::isInteger(source);
          if (bVar1) {
            fVar3 = soul::Value::getAsFloat(value);
            iVar2 = soul::Value::getAsInt32(value);
            return fVar3 == (float)iVar2;
          }
        }
        dest_local._7_1_ = false;
      }
    }
  }
  return dest_local._7_1_;
}

Assistant:

static bool canSilentlyCastTo (const Type& dest, const Value& value)
    {
        const auto& type = value.getType();

        if (dest.isUnsizedArray())
            return false;

        if (canSilentlyCastTo (dest, type))
            return true;

        if (dest.isBoundedInt() && (type.isInteger() || type.isBoundedInt()))
            return dest.isValidBoundedIntIndex (value.getAsInt64());

        if (dest.isFloat32())
        {
            if (type.isFloat64())
                return static_cast<double> (value.getAsFloat()) == value.getAsDouble();

            if (type.isInteger())
                return value.getAsFloat() == static_cast<float> (value.getAsInt32());
        }

        if (dest.isInteger())
        {
            if (type.isFloat64())
                return value.getAsInt32() == value.getAsDouble();

            if (type.isFloat32())
                return static_cast<float> (value.getAsInt32()) == value.getAsFloat();
        }

        if (dest.isComplex32())
        {
            if (type.isFloat64())
                return static_cast<double> (value.getAsFloat()) == value.getAsDouble();

            if (type.isInteger())
                return value.getAsFloat() == static_cast<float> (value.getAsInt32());
        }

        return false;
    }